

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall
BanMan::BanMan(BanMan *this,path ban_file,CClientUIInterface *client_interface,
              int64_t default_ban_time)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  int64_t in_RCX;
  long in_FS_OFFSET;
  path in_stack_ffffffffffffffa8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(this->m_banned_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_banned_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_banned_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_banned_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->m_banned_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var1 = &(this->m_banned)._M_t._M_impl.super__Rb_tree_header;
  (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_is_dirty = false;
  this->m_client_interface = (CClientUIInterface *)default_ban_time;
  std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffffb0,(path *)client_interface);
  CBanDB::CBanDB(&this->m_ban_db,(path)in_stack_ffffffffffffffa8);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffffb0);
  this->m_default_ban_time = in_RCX;
  CRollingBloomFilter::CRollingBloomFilter(&this->m_discouraged,50000,1e-06);
  LoadBanlist(this);
  DumpBanlist(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BanMan::BanMan(fs::path ban_file, CClientUIInterface* client_interface, int64_t default_ban_time)
    : m_client_interface(client_interface), m_ban_db(std::move(ban_file)), m_default_ban_time(default_ban_time)
{
    LoadBanlist();
    DumpBanlist();
}